

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void reduce_one(Parser *p,Reduction *r)

{
  uint32 *puVar1;
  ushort uVar2;
  uint uVar3;
  SNode *ps;
  ZNode *pZVar4;
  PNode *pn1;
  ZNode *pZVar5;
  SNode **ppSVar6;
  SNode *pSVar7;
  ZNode **ppZVar8;
  ZNode **ppZVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  PNode *pPVar13;
  VecZNode *pVVar14;
  PNode *pn2;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  D_Reduction *r_00;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  VecVecZNode paths;
  PNode *local_d8;
  ulong local_c0;
  VecVecZNode local_88;
  ulong local_60;
  SNode **local_58;
  ZNode **local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  ps = r->snode;
  r_00 = r->reduction;
  if (r->znode == (ZNode *)0x0) {
    pPVar13 = add_PNode(p,(uint)r_00->symbol,&ps->loc,(ps->loc).s,ps->last_pn,r_00,(VecZNode *)0x0,
                        (D_Shift *)0x0);
    if (pPVar13 != (PNode *)0x0) {
      goto_PNode(p,&ps->loc,pPVar13,ps);
    }
  }
  else {
    uVar2 = r_00->nelements;
    local_88.n = 0;
    local_88.v = (VecZNode **)0x0;
    if (uVar2 != 0) {
      path1.n = 0;
      path1.v = (ZNode **)0x0;
      local_88.v = local_88.e;
      local_88.n = 1;
      local_88.e[0] = &path1;
      build_paths_internal(r->znode,&local_88,0,(uint)uVar2,(uint)uVar2);
      if (local_88.n != 0) {
        local_38 = (ulong)(uVar2 - 1);
        uVar15 = 0;
        do {
          pVVar14 = local_88.v[uVar15];
          if (r->new_snode == (SNode *)0x0) {
LAB_00145320:
            uVar3 = pVVar14->n;
            ppZVar9 = pVVar14->v;
            pPVar13 = (*ppZVar9)->pn;
            if (1 < uVar3) {
              lVar18 = 0;
              local_d8 = pPVar13;
              if (pPVar13->op_assoc == ASSOC_NONE) {
                local_d8 = ppZVar9[1]->pn;
                if (local_d8->op_assoc == ASSOC_NONE) goto LAB_001455b9;
                if (pPVar13->assoc == ASSOC_NONE) {
                  lVar18 = 1;
                }
                else {
                  lVar18 = 1;
                  iVar12 = check_child(local_d8->op_priority,local_d8->op_assoc,pPVar13->priority,
                                       pPVar13->assoc,1,(int)r_00);
                  if (iVar12 == 0) goto LAB_0014564b;
                }
              }
              uVar11 = (uint)lVar18 + 1;
              if (uVar11 < uVar3) {
                pZVar4 = ppZVar9[uVar11];
                pn1 = pZVar4->pn;
                uVar11 = (uint)lVar18 | 2;
                if (uVar11 < uVar3) {
                  pn2 = ppZVar9[uVar11]->pn;
                }
                else {
                  uVar21 = (ulong)(pZVar4->sns).n;
                  if (uVar21 != 0) {
                    ppSVar6 = (pZVar4->sns).v;
                    bVar10 = true;
                    uVar17 = 0;
                    do {
                      while( true ) {
                        uVar19 = uVar17 + 1;
                        pSVar7 = ppSVar6[uVar17];
                        uVar16 = (ulong)(pSVar7->zns).n;
                        uVar17 = uVar19;
                        if (uVar16 != 0) break;
                        if (uVar19 == uVar21) {
                          if (bVar10) goto LAB_001455a2;
                          goto LAB_0014564b;
                        }
                      }
                      ppZVar8 = (pSVar7->zns).v;
                      uVar20 = 0;
                      do {
                        pZVar4 = ppZVar8[uVar20];
                        if ((pZVar4 != (ZNode *)0x0) &&
                           (iVar12 = check_assoc_priority(local_d8,pn1,pZVar4->pn), iVar12 == 0))
                        goto LAB_001455b9;
                        uVar20 = uVar20 + 1;
                      } while (uVar16 != uVar20);
                      bVar10 = false;
                    } while (uVar19 != uVar21);
                    goto LAB_0014564b;
                  }
LAB_001455a2:
                  pn2 = (PNode *)0x0;
                }
                iVar12 = check_assoc_priority(local_d8,pn1,pn2);
                if (iVar12 != 0) goto LAB_0014564b;
              }
              else {
                local_60 = (ulong)(ppZVar9[lVar18]->sns).n;
                if (local_60 != 0) {
                  local_58 = (ppZVar9[lVar18]->sns).v;
                  local_c0 = 0;
                  do {
                    local_48 = (ulong)(local_58[local_c0]->zns).n;
                    if (local_48 != 0) {
                      local_50 = (local_58[local_c0]->zns).v;
                      uVar21 = 0;
                      do {
                        pZVar4 = local_50[uVar21];
                        local_40 = uVar21;
                        if ((pZVar4 != (ZNode *)0x0) &&
                           (uVar21 = (ulong)(pZVar4->sns).n, uVar21 != 0)) {
                          ppSVar6 = (pZVar4->sns).v;
                          uVar17 = 0;
                          do {
                            pSVar7 = ppSVar6[uVar17];
                            uVar16 = (ulong)(pSVar7->zns).n;
                            if (uVar16 != 0) {
                              ppZVar8 = (pSVar7->zns).v;
                              uVar19 = 0;
                              do {
                                pZVar5 = ppZVar8[uVar19];
                                if ((pZVar5 != (ZNode *)0x0) &&
                                   (iVar12 = check_assoc_priority(local_d8,pZVar4->pn,pZVar5->pn),
                                   iVar12 == 0)) goto LAB_001455b9;
                                uVar19 = uVar19 + 1;
                              } while (uVar16 != uVar19);
                            }
                            uVar17 = uVar17 + 1;
                          } while (uVar17 != uVar21);
                        }
                        uVar21 = local_40 + 1;
                      } while (uVar21 != local_48);
                    }
                    local_c0 = local_c0 + 1;
                  } while (local_c0 != local_60);
                }
              }
            }
LAB_001455b9:
            p->reductions = p->reductions + 1;
            pZVar4 = ppZVar9[local_38];
            r_00 = r->reduction;
            pPVar13 = add_PNode(p,(uint)r_00->symbol,&(pZVar4->pn->parse_node).start_loc,(ps->loc).s
                                ,pPVar13,r_00,pVVar14,(D_Shift *)0x0);
            if ((pPVar13 != (PNode *)0x0) && ((pZVar4->sns).n != 0)) {
              uVar21 = 0;
              do {
                goto_PNode(p,&ps->loc,pPVar13,(pZVar4->sns).v[uVar21]);
                uVar21 = uVar21 + 1;
              } while (uVar21 < (pZVar4->sns).n);
            }
          }
          else {
            uVar21 = (ulong)(pVVar14->v[r->new_depth]->sns).n;
            if (uVar21 != 0) {
              uVar17 = 0;
              do {
                if ((pVVar14->v[r->new_depth]->sns).v[uVar17] == r->new_snode) goto LAB_00145320;
                uVar17 = uVar17 + 1;
              } while (uVar21 != uVar17);
            }
          }
LAB_0014564b:
          uVar15 = uVar15 + 1;
        } while (uVar15 < local_88.n);
        if (local_88.n != 0) {
          uVar15 = 0;
          do {
            pVVar14 = local_88.v[uVar15];
            ppZVar9 = pVVar14->v;
            if (ppZVar9 != pVVar14->e && ppZVar9 != (ZNode **)0x0) {
              free(ppZVar9);
              pVVar14 = local_88.v[uVar15];
            }
            pVVar14->n = 0;
            pVVar14->v = (ZNode **)0x0;
            if (local_88.v[uVar15] != &path1) {
              free(local_88.v[uVar15]);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < local_88.n);
        }
      }
    }
    if (local_88.v != local_88.e && local_88.v != (VecZNode **)0x0) {
      free(local_88.v);
    }
    local_88.n = 0;
    local_88.v = (VecZNode **)0x0;
  }
  puVar1 = &ps->refcount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    free_SNode(p,ps);
  }
  r->next = p->free_reductions;
  p->free_reductions = r;
  return;
}

Assistant:

static void reduce_one(Parser *p, Reduction *r) {
  SNode *sn = r->snode;
  PNode *pn, *last_pn;
  ZNode *first_z;
  uint i, j, n = r->reduction->nelements;
  VecVecZNode paths;
  VecZNode *path;

  if (!r->znode) { /* epsilon reduction */
    if ((pn = add_PNode(p, r->reduction->symbol, &sn->loc, sn->loc.s, sn->last_pn, r->reduction, 0, 0)))
      goto_PNode(p, &sn->loc, pn, sn);
  } else {
    DBG(printf("reduce %d %p %d\n", (int)(r->snode->state - p->t->state), (void *)sn, n));
    vec_clear(&paths);
    build_paths(r->znode, &paths, n);
    for (i = 0; i < paths.n; i++) {
      path = paths.v[i];
      if (r->new_snode) { /* prune paths by new right epsilon node */
        for (j = 0; j < path->v[r->new_depth]->sns.n; j++)
          if (path->v[r->new_depth]->sns.v[j] == r->new_snode) break;
        if (j >= path->v[r->new_depth]->sns.n) continue;
      }
      if (check_path_priorities(path)) continue;
      p->reductions++;
      last_pn = path->v[0]->pn;
      first_z = path->v[n - 1];
      pn = add_PNode(p, r->reduction->symbol, &first_z->pn->parse_node.start_loc, sn->loc.s, last_pn, r->reduction,
                     path, NULL);
      if (pn)
        for (j = 0; j < first_z->sns.n; j++) goto_PNode(p, &sn->loc, pn, first_z->sns.v[j]);
    }
    free_paths(&paths);
  }
  unref_sn(p, sn);
  r->next = p->free_reductions;
  p->free_reductions = r;
}